

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool __thiscall
bssl::spake2plus::Prover::ComputeConfirmation
          (Prover *this,Span<unsigned_char> out_confirm,Span<unsigned_char> out_secret,
          Span<const_unsigned_char> peer_share,Span<const_unsigned_char> peer_confirm)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  EC_GROUP *group_00;
  uchar *puVar4;
  uchar *puVar5;
  uchar *verifier_share;
  Span<const_unsigned_char> in;
  uint8_t local_658 [8];
  uint8_t verifier_confirm [32];
  EC_AFFINE V;
  EC_AFFINE Z;
  EC_JACOBIAN tmp;
  EC_JACOBIAN t;
  EC_JACOBIAN Y_j;
  EC_JACOBIAN r;
  uchar *local_1b0;
  undefined1 local_1a8 [8];
  EC_JACOBIAN N_j;
  EC_AFFINE Y;
  EC_GROUP *group;
  Prover *this_local;
  Span<unsigned_char> out_secret_local;
  Span<unsigned_char> out_confirm_local;
  
  puVar5 = (uchar *)out_secret.size_;
  this_local = (Prover *)out_secret.data_;
  out_secret_local.size_ = (size_t)out_confirm.data_;
  out_secret_local.data_ = puVar5;
  if ((((this->state_ == kShareGenerated) &&
       (sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&out_secret_local.size_),
       sVar3 == 0x20)) &&
      (sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&this_local), sVar3 == 0x20)) &&
     ((sVar3 = Span<const_unsigned_char>::size(&peer_share), sVar3 == 0x41 &&
      (sVar3 = Span<const_unsigned_char>::size(&peer_confirm), sVar3 == 0x20)))) {
    group_00 = EC_group_p256();
    puVar4 = Span<const_unsigned_char>::data(&peer_share);
    sVar3 = Span<const_unsigned_char>::size(&peer_share);
    iVar2 = ec_point_from_uncompressed(group_00,(EC_AFFINE *)(N_j.Z.words + 8),puVar4,sVar3);
    if (iVar2 == 0) {
      ERR_put_error(0xe,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                    ,0x14f);
    }
    else {
      Span<unsigned_char_const>::Span<65ul>
                ((Span<unsigned_char_const> *)(r.Z.words + 8),
                 (uchar (*) [65])(anonymous_namespace)::kN_bytes);
      in.size_ = (size_t)puVar5;
      in.data_ = local_1b0;
      anon_unknown_0::ConstantToJacobian
                ((anon_unknown_0 *)group_00,(EC_GROUP *)local_1a8,(EC_JACOBIAN *)r.Z.words[8],in);
      iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(Y_j.Z.words + 8),(EC_JACOBIAN *)local_1a8
                                  ,&this->w0_);
      if (iVar2 == 0) {
        ERR_put_error(0xe,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                      ,0x158);
      }
      else {
        ec_felem_neg(group_00,(EC_FELEM *)(r.X.words + 8),(EC_FELEM *)(r.X.words + 8));
        ec_affine_to_jacobian
                  (group_00,(EC_JACOBIAN *)(t.Z.words + 8),(EC_AFFINE *)(N_j.Z.words + 8));
        (*group_00->meth->add)
                  (group_00,(EC_JACOBIAN *)(tmp.Z.words + 8),(EC_JACOBIAN *)(t.Z.words + 8),
                   (EC_JACOBIAN *)(Y_j.Z.words + 8));
        iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(Z.Y.words + 8),
                                    (EC_JACOBIAN *)(tmp.Z.words + 8),&this->x_);
        if (((iVar2 != 0) &&
            (iVar2 = ec_jacobian_to_affine
                               (group_00,(EC_AFFINE *)(V.Y.words + 8),(EC_JACOBIAN *)(Z.Y.words + 8)
                               ), iVar2 != 0)) &&
           ((iVar2 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)(Z.Y.words + 8),
                                         (EC_JACOBIAN *)(tmp.Z.words + 8),&this->w1_), iVar2 != 0 &&
            (iVar2 = ec_jacobian_to_affine
                               (group_00,(EC_AFFINE *)(verifier_confirm + 0x18),
                                (EC_JACOBIAN *)(Z.Y.words + 8)), iVar2 != 0)))) {
          puVar5 = Span<unsigned_char>::data((Span<unsigned_char> *)&out_secret_local.size_);
          puVar4 = Span<unsigned_char>::data((Span<unsigned_char> *)&this_local);
          verifier_share = Span<const_unsigned_char>::data(&peer_share);
          bVar1 = anon_unknown_0::ComputeTranscript
                            (puVar5,local_658,puVar4,this->share_,verifier_share,
                             &this->transcript_hash_,(EC_AFFINE *)(V.Y.words + 8),
                             (EC_AFFINE *)(verifier_confirm + 0x18),&this->w0_);
          if (bVar1) {
            puVar5 = Span<const_unsigned_char>::data(&peer_confirm);
            iVar2 = CRYPTO_memcmp(local_658,puVar5,0x20);
            if (iVar2 == 0) {
              this->state_ = kDone;
              return true;
            }
          }
        }
      }
    }
  }
  else {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0x147);
  }
  return false;
}

Assistant:

bool Prover::ComputeConfirmation(Span<uint8_t> out_confirm,
                                 Span<uint8_t> out_secret,
                                 Span<const uint8_t> peer_share,
                                 Span<const uint8_t> peer_confirm) {
  if (state_ != State::kShareGenerated || out_confirm.size() != kConfirmSize ||
      out_secret.size() != kSecretSize || peer_share.size() != kShareSize ||
      peer_confirm.size() != kConfirmSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  EC_AFFINE Y;
  if (!ec_point_from_uncompressed(group, &Y, peer_share.data(),
                                  peer_share.size())) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN N_j;
  ConstantToJacobian(group, &N_j, kN_bytes);

  EC_JACOBIAN r;
  if (!ec_point_mul_scalar(group, &r, &N_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  ec_felem_neg(group, &r.Y, &r.Y);

  EC_JACOBIAN Y_j;
  ec_affine_to_jacobian(group, &Y_j, &Y);

  EC_JACOBIAN t;
  group->meth->add(group, &t, &Y_j, &r);

  EC_JACOBIAN tmp;
  EC_AFFINE Z, V;
  // TODO(crbug.com/383778231): The two affine conversions could be batched
  // together.
  if (!ec_point_mul_scalar(group, &tmp, &t, &x_) ||   //
      !ec_jacobian_to_affine(group, &Z, &tmp) ||      //
      !ec_point_mul_scalar(group, &tmp, &t, &w1_) ||  //
      !ec_jacobian_to_affine(group, &V, &tmp)) {
    return 0;
  }

  uint8_t verifier_confirm[kConfirmSize];
  if (!ComputeTranscript(out_confirm.data(), verifier_confirm,
                         out_secret.data(), share_, peer_share.data(),
                         &transcript_hash_, &Z, &V, &w0_) ||
      CRYPTO_memcmp(verifier_confirm, peer_confirm.data(),
                    sizeof(verifier_confirm)) != 0) {
    return 0;
  }

  state_ = State::kDone;
  return true;
}